

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::changeRow
          (SPxLPBase<double> *this,int n,LPRowBase<double> *newRow,bool scale)

{
  Item *pIVar1;
  int iVar2;
  Nonzero<double> *pNVar3;
  byte bVar4;
  LPRowBase<double> *pLVar5;
  uint uVar6;
  undefined7 in_register_00000009;
  Item *pIVar7;
  ulong uVar8;
  long lVar9;
  int n_local;
  undefined4 local_48;
  int idx;
  double val;
  LPRowBase<double> *local_38;
  
  local_48 = (undefined4)CONCAT71(in_register_00000009,scale);
  if (-1 < n) {
    pIVar7 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
    iVar2 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[(uint)n].idx;
    pIVar1 = pIVar7 + iVar2;
    uVar8 = (ulong)(uint)pIVar7[iVar2].data.super_SVectorBase<double>.memused;
    lVar9 = uVar8 * 0x10 + -8;
    n_local = n;
    local_38 = newRow;
    for (; pLVar5 = local_38, 0 < (int)uVar8; uVar8 = (ulong)((int)uVar8 - 1)) {
      pIVar7 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
               (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey
               [*(int *)((long)&((pIVar1->data).super_SVectorBase<double>.m_elem)->val + lVar9)].idx
      ;
      uVar6 = SVectorBase<double>::pos((SVectorBase<double> *)pIVar7,n);
      if (-1 < (int)uVar6) {
        SVectorBase<double>::remove((SVectorBase<double> *)pIVar7,(char *)(ulong)uVar6);
      }
      lVar9 = lVar9 + -0x10;
    }
    (pIVar1->data).super_SVectorBase<double>.memused = 0;
    val = local_38->left;
    bVar4 = (byte)local_48;
    uVar8 = (ulong)(byte)local_48;
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x33])
              (this,(ulong)(uint)n,&val,uVar8);
    val = pLVar5->right;
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x36])
              (this,(ulong)(uint)n,&val,(ulong)bVar4);
    val = pLVar5->object;
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x3c])
              (this,(ulong)(uint)n,&val,uVar8);
    uVar8 = (ulong)(uint)(pLVar5->vec).super_SVectorBase<double>.memused;
    lVar9 = uVar8 * 0x10 + -8;
    for (; 0 < (int)uVar8; uVar8 = (ulong)((int)uVar8 - 1)) {
      pNVar3 = (local_38->vec).super_SVectorBase<double>.m_elem;
      idx = *(int *)((long)&pNVar3->val + lVar9);
      val = *(double *)((long)pNVar3 + lVar9 + -8);
      if ((byte)local_48 != '\0') {
        val = ldexp(val,(this->super_LPColSetBase<double>).scaleExp.data[idx] +
                        (this->super_LPRowSetBase<double>).scaleExp.data[n_local]);
      }
      LPRowSetBase<double>::add2(&this->super_LPRowSetBase<double>,n_local,1,&idx,&val);
      LPColSetBase<double>::add2(&this->super_LPColSetBase<double>,idx,1,&n_local,&val);
      lVar9 = lVar9 + -0x10;
    }
  }
  return;
}

Assistant:

virtual void changeRow(int n, const LPRowBase<R>& newRow, bool scale = false)
   {
      if(n < 0)
         return;

      int j;
      SVectorBase<R>& row = rowVector_w(n);

      for(j = row.size() - 1; j >= 0; --j)
      {
         SVectorBase<R>& col = colVector_w(row.index(j));
         int position = col.pos(n);

         assert(position != -1);

         if(position >= 0)
            col.remove(position);
      }

      row.clear();

      changeLhs(n, newRow.lhs(), scale);
      changeRhs(n, newRow.rhs(), scale);
      changeRowObj(n, newRow.obj(), scale);

      const SVectorBase<R>& newrow = newRow.rowVector();

      for(j = newrow.size() - 1; j >= 0; --j)
      {
         int idx = newrow.index(j);
         R val = newrow.value(j);

         if(scale)
            val = spxLdexp(val, LPRowSetBase<R>::scaleExp[n] + LPColSetBase<R>::scaleExp[idx]);

         LPRowSetBase<R>::add2(n, 1, &idx, &val);
         LPColSetBase<R>::add2(idx, 1, &n, &val);
      }

      assert(isConsistent());
   }